

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<int>::SolveJacobi
          (TPZMatrix<int> *this,int64_t *numiterations,TPZFMatrix<int> *F,TPZFMatrix<int> *result,
          TPZFMatrix<int> *residual,TPZFMatrix<int> *scratch,REAL *tol,int FromCurrent)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int64_t iVar5;
  int *piVar6;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  undefined8 in_R9;
  double *in_stack_00000008;
  int in_stack_00000010;
  int64_t i;
  int64_t ic;
  int64_t it;
  int64_t c;
  int64_t r;
  REAL res;
  TPZFMatrix<int> *in_stack_ffffffffffffffa0;
  TPZFMatrix<int> *in_stack_ffffffffffffffa8;
  TPZFMatrix<int> *this_00;
  double local_38;
  
  if (in_stack_00000010 == 0) {
    TPZFMatrix<int>::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (**(code **)(*in_RCX + 0x78))();
  }
  else {
    (**(code **)(*in_RDI + 0x140))(in_RDI,in_RCX,in_RDX,in_R9);
  }
  iVar2 = ::Norm((TPZFMatrix<int> *)0x12f22b8);
  local_38 = TPZExtractVal::val(iVar2);
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  iVar5 = TPZBaseMatrix::Cols(in_RDX);
  this_00 = (TPZFMatrix<int> *)0x0;
  while( true ) {
    bVar1 = false;
    if ((long)this_00 < *in_RSI) {
      bVar1 = *in_stack_00000008 <= ABS(local_38) && ABS(local_38) != *in_stack_00000008;
    }
    if (!bVar1) break;
    for (in_stack_ffffffffffffffa8 = (TPZFMatrix<int> *)0x0; (long)in_stack_ffffffffffffffa8 < iVar5
        ; in_stack_ffffffffffffffa8 =
               (TPZFMatrix<int> *)
               ((long)&(in_stack_ffffffffffffffa8->super_TPZMatrix<int>).super_TPZBaseMatrix.
                       super_TPZSavable._vptr_TPZSavable + 1)) {
      for (in_stack_ffffffffffffffa0 = (TPZFMatrix<int> *)0x0;
          (long)in_stack_ffffffffffffffa0 < lVar4;
          in_stack_ffffffffffffffa0 =
               (TPZFMatrix<int> *)
               ((long)&(in_stack_ffffffffffffffa0->super_TPZMatrix<int>).super_TPZBaseMatrix.
                       super_TPZSavable._vptr_TPZSavable + 1)) {
        piVar6 = TPZFMatrix<int>::operator()
                           (this_00,(int64_t)in_stack_ffffffffffffffa8,
                            (int64_t)in_stack_ffffffffffffffa0);
        iVar2 = *piVar6;
        iVar3 = (**(code **)(*in_RDI + 0x120))
                          (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa0);
        piVar6 = TPZFMatrix<int>::operator()
                           (this_00,(int64_t)in_stack_ffffffffffffffa8,
                            (int64_t)in_stack_ffffffffffffffa0);
        *piVar6 = iVar2 / iVar3 + *piVar6;
      }
    }
    (**(code **)(*in_RDI + 0x140))(in_RDI,in_RCX,in_RDX,in_R9);
    iVar2 = ::Norm((TPZFMatrix<int> *)0x12f2408);
    local_38 = TPZExtractVal::val(iVar2);
    this_00 = (TPZFMatrix<int> *)
              ((long)&(this_00->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable + 1);
  }
  if (in_R8 != 0) {
    TPZFMatrix<int>::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}